

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetWindowSize(ImGuiWindow *window,ImVec2 *size,ImGuiCond cond)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  
  if ((cond == 0) || (((char)window->field_0xbd & cond) != 0)) {
    window->field_0xbd = window->field_0xbd & 0xf1;
    fVar2 = (window->SizeFull).x;
    fVar3 = (window->SizeFull).y;
    window->AutoFitFramesX = (size->x <= 0.0) * '\x02';
    window->AutoFitFramesY = (size->y <= 0.0) * '\x02';
    if (size->x <= 0.0) {
      window->AutoFitOnlyGrows = false;
    }
    else {
      (window->SizeFull).x = (float)(int)size->x;
    }
    if (size->y <= 0.0) {
      window->AutoFitOnlyGrows = false;
    }
    else {
      (window->SizeFull).y = (float)(int)size->y;
    }
    if ((fVar2 == (window->SizeFull).x) && (!NAN(fVar2) && !NAN((window->SizeFull).x))) {
      pfVar1 = &(window->SizeFull).y;
      if ((fVar3 == *pfVar1) && (!NAN(fVar3) && !NAN(*pfVar1))) {
        return;
      }
    }
    if (((window->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
      GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
    }
  }
  return;
}

Assistant:

void ImGui::SetWindowSize(ImGuiWindow* window, const ImVec2& size, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowSizeAllowFlags & cond) == 0)
        return;

    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    window->SetWindowSizeAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);

    // Set
    ImVec2 old_size = window->SizeFull;
    window->AutoFitFramesX = (size.x <= 0.0f) ? 2 : 0;
    window->AutoFitFramesY = (size.y <= 0.0f) ? 2 : 0;
    if (size.x <= 0.0f)
        window->AutoFitOnlyGrows = false;
    else
        window->SizeFull.x = IM_FLOOR(size.x);
    if (size.y <= 0.0f)
        window->AutoFitOnlyGrows = false;
    else
        window->SizeFull.y = IM_FLOOR(size.y);
    if (old_size.x != window->SizeFull.x || old_size.y != window->SizeFull.y)
        MarkIniSettingsDirty(window);
}